

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

void __thiscall
IRBuilder::BuildLdSpreadIndices(IRBuilder *this,uint32 offset,uint32 spreadAuxOffset)

{
  RealCount *pRVar1;
  Func *func;
  Opnd *this_00;
  SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  OpndKind OVar6;
  ArgSlot AVar7;
  AddrOpnd *this_01;
  Instr *this_02;
  undefined4 *puVar8;
  Type *ppIVar9;
  StackSym *pSVar10;
  SymOpnd *newDst;
  Type pSVar11;
  
  this_01 = BuildAuxArrayOpnd(this,AuxIntArray,spreadAuxOffset);
  this_02 = IR::Instr::New(LdSpreadIndices,this->m_func);
  if (this_02->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar4) goto LAB_004d3ec7;
    *puVar8 = 0;
  }
  func = this_02->m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar4) goto LAB_004d3ec7;
    *puVar8 = 0;
  }
  bVar5 = (this_01->super_Opnd).field_0xb;
  if ((bVar5 & 2) != 0) {
    this_01 = (AddrOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,func);
    bVar5 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar5 | 2;
  this_02->m_src1 = &this_01->super_Opnd;
  ppIVar9 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->m_argStack->
                        super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
  this_00 = (*ppIVar9)->m_dst;
  OVar6 = IR::Opnd::GetKind(this_00);
  if (OVar6 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar4) {
LAB_004d3ec7:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  pSVar10 = IR::Opnd::GetStackSym(this_00);
  AVar7 = StackSym::GetArgSlotNum(pSVar10);
  pSVar10 = SymTable::GetArgSlotSym(this->m_func->m_symTable,AVar7 + 1);
  newDst = IR::SymOpnd::New(&pSVar10->super_Sym,TyVar,this->m_func);
  IR::Instr::SetDst(this_02,&newDst->super_Opnd);
  AddInstr(this,this_02,0xffffffff);
  pSVar2 = this->m_argStack;
  pSVar11 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar2->allocator,0x364470);
  pSVar11[1].next = (Type)this_02;
  pSVar11->next =
       (pSVar2->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
       super_SListNodeBase<Memory::ArenaAllocator>.next;
  (pSVar2->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar11;
  pRVar1 = &(pSVar2->super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>).
            super_RealCount;
  pRVar1->count = pRVar1->count + 1;
  return;
}

Assistant:

void IRBuilder::BuildLdSpreadIndices(uint32 offset, uint32 spreadAuxOffset)
{
    // Link up the LdSpreadIndices instr to be the first in the arg chain. This will allow us to find it in Lowerer easier.
    IR::Opnd *auxArg = this->BuildAuxArrayOpnd(AuxArrayValue::AuxIntArray, spreadAuxOffset);
    IR::Instr *instr = IR::Instr::New(Js::OpCode::LdSpreadIndices, m_func);
    instr->SetSrc1(auxArg);

    // Create the link to the first arg.
    Js::RegSlot lastArg = m_argStack->Head()->GetDst()->AsSymOpnd()->GetStackSym()->GetArgSlotNum();
    instr->SetDst(IR::SymOpnd::New(m_func->m_symTable->GetArgSlotSym((uint16) (lastArg + 1)), TyVar, m_func));
    this->AddInstr(instr, Js::Constants::NoByteCodeOffset);

    m_argStack->Push(instr);
}